

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

lbool __thiscall Minisat::Solver::search(Solver *this,int *nof_conflicts)

{
  uint64_t uVar1;
  bool bVar2;
  bool bVar3;
  uint64_t uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  CRef CVar11;
  Solver *this_00;
  Lit *pLVar12;
  Clause *pCVar13;
  uint32_t *puVar14;
  int *piVar15;
  char *pcVar16;
  byte *pbVar17;
  reference pvVar18;
  ulong uVar19;
  int *in_RSI;
  Solver *in_RDI;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ConflictData CVar24;
  Solver *in_stack_00000058;
  int *in_stack_000000a0;
  int *in_stack_000000a8;
  vec<Minisat::Lit> *in_stack_000000b0;
  CRef in_stack_000000bc;
  Solver *in_stack_000000c0;
  Lit p;
  Lit next;
  bool successful_reduced;
  int restartLevel;
  bool restart;
  bool res;
  lbool value_i;
  int idx_i;
  int var_nums;
  CRef cr;
  Solver *in_stack_00000100;
  int btLevel;
  ConflictData data;
  CRef confl;
  CRef prev_confl;
  CRef this_confl;
  bool can_call_ls;
  bool cached;
  int lbd;
  int backtrack_level;
  undefined1 in_stack_00000e47;
  Solver *in_stack_00000e48;
  int in_stack_fffffffffffffea8;
  Ref in_stack_fffffffffffffeac;
  Solver *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Lit in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  float fVar25;
  int in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee4;
  value_type in_stack_fffffffffffffee6;
  byte in_stack_fffffffffffffee7;
  Solver *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  uint in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  uint32_t in_stack_ffffffffffffff20;
  Lit in_stack_ffffffffffffff24;
  CRef in_stack_ffffffffffffff28;
  CRef in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  Lit in_stack_ffffffffffffff34;
  Lit in_stack_ffffffffffffff50;
  Lit in_stack_ffffffffffffff54;
  Lit in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  lbool local_91;
  int local_90;
  lbool local_8a;
  lbool local_89;
  int local_88;
  lbool local_81;
  Lit local_80;
  Lit local_7c;
  undefined1 local_75;
  uint local_74;
  byte local_6d;
  undefined1 local_6c;
  lbool local_6b;
  lbool local_6a;
  lbool local_69;
  int local_68;
  int local_64;
  int local_60;
  CRef local_5c;
  int local_58;
  CRef in_stack_ffffffffffffffac;
  int local_3c;
  int iStack_38;
  CRef local_28;
  int local_20;
  int local_1c;
  lbool local_1;
  
  vec<Minisat::Lit>::clear
            ((vec<Minisat::Lit> *)in_stack_fffffffffffffeb0,
             SUB41(in_stack_fffffffffffffeac >> 0x18,0));
  bVar3 = false;
  in_RDI->starts = in_RDI->starts + 1;
  in_RDI->freeze_ls_restart_num = in_RDI->freeze_ls_restart_num + -1;
  bVar2 = true;
  if ((in_RDI->consumeSharedCls != (_func_void_void_ptr *)0x0) &&
     ((in_RDI->receiveClauses & 1U) != 0)) {
    (*in_RDI->consumeSharedCls)(in_RDI->issuer);
  }
  if (((in_RDI->allow_rephasing & 1U) != 0) &&
     (in_RDI->state_change_time < (long)in_RDI->solve_starts + in_RDI->starts)) {
    if ((in_RDI->called_initial_sls & 1U) == 0) {
      call_ls(in_stack_00000e48,(bool)in_stack_00000e47);
    }
    uVar1 = in_RDI->state_change_time;
    auVar22._8_4_ = (int)(uVar1 >> 0x20);
    auVar22._0_8_ = uVar1;
    auVar22._12_4_ = 0x45300000;
    dVar20 = (auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) +
             in_RDI->state_change_time_inc;
    uVar19 = (ulong)dVar20;
    in_RDI->state_change_time =
         uVar19 | (long)(dVar20 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f;
    dVar20 = in_RDI->state_change_time_inc_inc * in_RDI->state_change_time_inc;
    in_RDI->state_change_time_inc = dVar20;
    in_RDI->state_change_time_inc = dVar20;
    iVar6 = rand();
    if (iVar6 % 100 < 0x32) {
      info_based_rephase((Solver *)
                         CONCAT17(in_stack_fffffffffffffee7,
                                  CONCAT16(in_stack_fffffffffffffee6,
                                           CONCAT24(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0))));
    }
    else {
      rand_based_rephase((Solver *)
                         CONCAT17(in_stack_fffffffffffffee7,
                                  CONCAT16(in_stack_fffffffffffffee6,
                                           CONCAT24(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0))));
    }
  }
  if (((in_RDI->lcm & 1U) != 0) &&
     (in_RDI->curSimplify * in_RDI->nbconfbeforesimplify <= in_RDI->conflicts)) {
    if (0 < in_RDI->verbosity) {
      uVar7 = vec<unsigned_int>::size(&in_RDI->clauses);
      uVar8 = vec<unsigned_int>::size(&in_RDI->learnts_core);
      uVar9 = vec<unsigned_int>::size(&in_RDI->learnts_tier2);
      uVar10 = vec<unsigned_int>::size(&in_RDI->learnts_local);
      in_stack_ffffffffffffff30 = vec<unsigned_int>::size(&in_RDI->learnts_core);
      iVar6 = vec<unsigned_int>::size(&in_RDI->learnts_tier2);
      in_stack_ffffffffffffff34.x = in_stack_ffffffffffffff30 + iVar6;
      iVar6 = vec<unsigned_int>::size(&in_RDI->learnts_local);
      printf("c schedule LCM with: nbClauses: %d, nbLearnts_core: %d, nbLearnts_tier2: %d, nbLearnts_local: %d, nbLearnts: %d\n"
             ,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9,(ulong)uVar10,
             (ulong)(uint)(in_stack_ffffffffffffff34.x + iVar6));
    }
    in_RDI->nbSimplifyAll = in_RDI->nbSimplifyAll + 1;
    bVar5 = simplifyAll((Solver *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (!bVar5) {
      lbool::lbool(&local_1,'\x01');
      return (lbool)local_1.value;
    }
    in_RDI->curSimplify = in_RDI->conflicts / in_RDI->nbconfbeforesimplify + 1;
    in_RDI->nbconfbeforesimplify = (long)in_RDI->incSimplify + in_RDI->nbconfbeforesimplify;
  }
  bVar5 = okay(in_RDI);
  if (!bVar5) {
    lbool::lbool(&local_1,'\x01');
    return (lbool)local_1.value;
  }
  inprocessing(in_stack_00000058);
  prefetchAssumptions((Solver *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_28 = 0xffffffff;
  do {
    while (CVar11 = propagate(in_stack_00000100), CVar11 != 0xffffffff) {
      bVar5 = usesVSIDS(in_RDI);
      if (bVar5) {
        iVar6 = in_RDI->var_decay_timer + -1;
        in_RDI->var_decay_timer = iVar6;
        if ((iVar6 == 0) && (in_RDI->var_decay <= 0.95 && in_RDI->var_decay != 0.95)) {
          in_RDI->var_decay_timer = in_RDI->var_decay_timer_init;
          in_RDI->var_decay = in_RDI->var_decay + 0.01;
        }
      }
      else if (in_RDI->min_step_size <= in_RDI->step_size &&
               in_RDI->step_size != in_RDI->min_step_size) {
        in_RDI->step_size = in_RDI->step_size - in_RDI->step_size_dec;
      }
      in_RDI->conflicts = in_RDI->conflicts + 1;
      *in_RSI = *in_RSI + -1;
      if ((in_RDI->conflicts == 100000) &&
         (iVar6 = vec<unsigned_int>::size(&in_RDI->learnts_core), iVar6 < 100)) {
        in_RDI->core_lbd_cut = 5;
      }
      CVar24 = FindConflictLevel((Solver *)
                                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff5c.x);
      this_00 = CVar24._0_8_;
      local_3c = CVar24.nHighestLevel;
      if (local_3c == 0) {
        lbool::lbool(&local_1,'\x01');
        return (lbool)local_1.value;
      }
      if (((undefined1  [12])CVar24 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        vec<Minisat::Lit>::clear
                  ((vec<Minisat::Lit> *)in_stack_fffffffffffffeb0,
                   SUB41(in_stack_fffffffffffffeac >> 0x18,0));
        if (in_RDI->conflicts < 0xc351) {
          bVar5 = considersDISTANCE(in_RDI);
          if (!bVar5) {
            if (in_RDI->verbosity != 0) {
              printf("c set DISTANCE to 1\n");
            }
            enableDISTANCEheuristic
                      ((Solver *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.x));
          }
        }
        else {
          bVar5 = considersDISTANCE(in_RDI);
          if (bVar5) {
            if (in_RDI->verbosity != 0) {
              printf("c set DISTANCE to 0\n");
            }
            disableDISTANCEheuristic
                      ((Solver *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.x));
          }
        }
        if (in_RDI->current_heuristic == VSIDS_DISTANCE) {
          collectFirstUIP(this_00,in_stack_ffffffffffffffac);
        }
        analyze(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0,in_stack_000000a8,
                in_stack_000000a0);
        if ((((in_RDI->confl_to_chrono < 0) || (in_RDI->confl_to_chrono <= (long)in_RDI->conflicts))
            && (-1 < in_RDI->chrono)) &&
           (iVar6 = decisionLevel((Solver *)0x139288), in_RDI->chrono <= (long)(iVar6 - local_1c)))
        {
          in_RDI->chrono_backtrack = in_RDI->chrono_backtrack + 1;
          cancelUntil((Solver *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50.x),
                      (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
        }
        else {
          in_RDI->non_chrono_backtrack = in_RDI->non_chrono_backtrack + 1;
          cancelUntil((Solver *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50.x),
                      (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
        }
        local_20 = local_20 + -1;
        bVar5 = usesVSIDS(in_RDI);
        if (bVar5) {
          bVar3 = false;
          in_RDI->conflicts_VSIDS = in_RDI->conflicts_VSIDS + 1;
          MyQueue<int>::push((MyQueue<int> *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.x),
                             in_stack_fffffffffffffebc);
          in_stack_ffffffffffffff24.x = local_20;
          if (0x32 < local_20) {
            in_stack_ffffffffffffff24.x = 0x32;
          }
          in_RDI->global_lbd_sum = (float)in_stack_ffffffffffffff24.x + in_RDI->global_lbd_sum;
        }
        shareViaCallback<Minisat::vec<Minisat::Lit>>
                  ((Solver *)CONCAT44(in_stack_ffffffffffffff34.x,in_stack_ffffffffffffff30),
                   (vec<Minisat::Lit> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff24.x);
        iVar6 = vec<Minisat::Lit>::size(&in_RDI->learnt_clause);
        if (iVar6 == 1) {
          pLVar12 = vec<Minisat::Lit>::operator[](&in_RDI->learnt_clause,0);
          local_58 = pLVar12->x;
          uncheckedEnqueue((Solver *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           in_stack_ffffffffffffff34,in_stack_ffffffffffffff24.x,
                           in_stack_ffffffffffffff20);
        }
        else {
          local_5c = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                               ((ClauseAllocator *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (vec<Minisat::Lit> *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                SUB41((uint)in_stack_fffffffffffffec4 >> 0x18,0));
          pCVar13 = ClauseAllocator::operator[]
                              ((ClauseAllocator *)in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffeac);
          Clause::set_lbd(pCVar13,local_20);
          if (in_RDI->core_lbd_cut < local_20) {
            if (local_20 < 7) {
              vec<unsigned_int>::push
                        ((vec<unsigned_int> *)in_stack_fffffffffffffeb0,
                         (uint *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              pCVar13 = ClauseAllocator::operator[]
                                  ((ClauseAllocator *)in_stack_fffffffffffffeb0,
                                   in_stack_fffffffffffffeac);
              Clause::mark(pCVar13,2);
              in_stack_ffffffffffffff1c = (uint32_t)in_RDI->conflicts;
              pCVar13 = ClauseAllocator::operator[]
                                  ((ClauseAllocator *)in_stack_fffffffffffffeb0,
                                   in_stack_fffffffffffffeac);
              puVar14 = Clause::touched(pCVar13);
              *puVar14 = in_stack_ffffffffffffff1c;
            }
            else {
              vec<unsigned_int>::push
                        ((vec<unsigned_int> *)in_stack_fffffffffffffeb0,
                         (uint *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              ClauseAllocator::operator[]
                        ((ClauseAllocator *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
              claBumpActivity((Solver *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (Clause *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            }
          }
          else {
            vec<unsigned_int>::push
                      ((vec<unsigned_int> *)in_stack_fffffffffffffeb0,
                       (uint *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            pCVar13 = ClauseAllocator::operator[]
                                ((ClauseAllocator *)in_stack_fffffffffffffeb0,
                                 in_stack_fffffffffffffeac);
            Clause::mark(pCVar13,3);
            in_stack_ffffffffffffff20 = (uint32_t)in_RDI->conflicts;
            pCVar13 = ClauseAllocator::operator[]
                                ((ClauseAllocator *)in_stack_fffffffffffffeb0,
                                 in_stack_fffffffffffffeac);
            puVar14 = Clause::touched(pCVar13);
            *puVar14 = in_stack_ffffffffffffff20;
          }
          attachClause((Solver *)CONCAT44(in_stack_ffffffffffffff24.x,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
          (in_RDI->statistics).solveSteps = (in_RDI->statistics).solveSteps + 1;
          pLVar12 = vec<Minisat::Lit>::operator[](&in_RDI->learnt_clause,0);
          local_60 = pLVar12->x;
          uncheckedEnqueue((Solver *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           in_stack_ffffffffffffff34,in_stack_ffffffffffffff24.x,
                           in_stack_ffffffffffffff20);
        }
        if (in_RDI->drup_file != (FILE *)0x0) {
          binDRUP<Minisat::vec<Minisat::Lit>>
                    ((Solver *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (uchar)((uint)in_stack_fffffffffffffecc >> 0x18),
                     (vec<Minisat::Lit> *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.x),
                     (FILE *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        }
        bVar5 = usesVSIDS(in_RDI);
        if (bVar5) {
          varDecayActivity(in_RDI);
        }
        claDecayActivity(in_RDI);
        if ((0 < in_RDI->verbosity) && (in_RDI->conflicts % (ulong)(long)in_RDI->status_every == 0))
        {
          in_stack_ffffffffffffff14 = (uint)in_RDI->conflicts;
          in_stack_ffffffffffffff18 = (int)in_RDI->dec_vars;
          iVar6 = vec<int>::size(&in_RDI->trail_lim);
          if (iVar6 == 0) {
            in_stack_ffffffffffffff10 = vec<Minisat::Lit>::size(&in_RDI->trail);
          }
          else {
            piVar15 = vec<int>::operator[](&in_RDI->trail_lim,0);
            in_stack_ffffffffffffff10 = *piVar15;
          }
          in_stack_fffffffffffffef4 = in_stack_ffffffffffffff18 - in_stack_ffffffffffffff10;
          uVar7 = nClauses((Solver *)0x139735);
          uVar4 = in_RDI->clauses_literals;
          in_stack_ffffffffffffff00 = (uint)in_RDI->max_learnts;
          in_stack_fffffffffffffea8 = nLearnts(in_stack_fffffffffffffeb0);
          uVar1 = in_RDI->learnts_literals;
          auVar23._8_4_ = (int)(uVar1 >> 0x20);
          auVar23._0_8_ = uVar1;
          auVar23._12_4_ = 0x45300000;
          in_stack_fffffffffffffee8 =
               (Solver *)
               ((auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
          iVar6 = nLearnts(in_stack_fffffffffffffeb0);
          dVar20 = (double)in_stack_fffffffffffffee8 / (double)iVar6;
          dVar21 = progressEstimate((Solver *)
                                    CONCAT17(in_stack_fffffffffffffee7,
                                             CONCAT16(in_stack_fffffffffffffee6,
                                                      CONCAT24(in_stack_fffffffffffffee4,
                                                               in_stack_fffffffffffffee0))));
          in_stack_ffffffffffffff04 = in_stack_fffffffffffffea8;
          printf("c | %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n",dVar20,dVar21 * 100.0,
                 (ulong)in_stack_ffffffffffffff14,(ulong)in_stack_fffffffffffffef4,(ulong)uVar7,
                 (ulong)(uint)uVar4,(ulong)in_stack_ffffffffffffff00);
        }
        iVar6 = vec<Minisat::Lit>::size(&in_RDI->trail);
        local_28 = CVar11;
        if (in_RDI->max_trail < iVar6) {
          iVar6 = vec<Minisat::Lit>::size(&in_RDI->trail);
          in_RDI->max_trail = iVar6;
          local_64 = nVars((Solver *)0x13984d);
          for (local_68 = 0; local_68 < local_64; local_68 = local_68 + 1) {
            local_69 = value((Solver *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                             ,0);
            lbool::lbool(&local_6a,'\x02');
            bVar5 = lbool::operator==(&local_69,local_6a);
            if (bVar5) {
              pcVar16 = vec<char>::operator[](&in_RDI->polarity,local_68);
              in_stack_fffffffffffffee7 = (*pcVar16 != '\0' ^ 0xffU) & 1;
              pbVar17 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                          (&in_RDI->top_trail_soln,(long)local_68);
              *pbVar17 = in_stack_fffffffffffffee7;
            }
            else {
              lbool::lbool(&local_6b,'\0');
              in_stack_fffffffffffffee6 = lbool::operator==(&local_69,local_6b);
              pvVar18 = std::vector<char,_std::allocator<char>_>::operator[]
                                  (&in_RDI->top_trail_soln,(long)local_68);
              *pvVar18 = in_stack_fffffffffffffee6;
            }
          }
        }
      }
      else {
        iStack_38 = local_3c;
        if (local_28 == CVar11) {
          iStack_38 = CVar24.secondHighestLevel;
        }
        in_stack_ffffffffffffff2c = iStack_38 - 1;
        in_stack_ffffffffffffff28 = in_stack_ffffffffffffff2c;
        if ((int)in_stack_ffffffffffffff2c < 0) {
          in_stack_ffffffffffffff28 = 0;
        }
        in_stack_ffffffffffffffac = in_stack_ffffffffffffff28;
        cancelUntil((Solver *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50.x),
                    (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
        local_28 = CVar11;
      }
    }
    if (((in_RDI->state_change_time < (long)in_RDI->solve_starts + in_RDI->starts) && (bVar2)) &&
       ((in_RDI->freeze_ls_restart_num < 1 && ((in_RDI->mediation_used & 1U) != 0)))) {
      in_stack_fffffffffffffee0 = vec<Minisat::Lit>::size(&in_RDI->trail);
      fVar25 = in_RDI->conflict_ratio;
      iVar6 = nVars((Solver *)0x139a0e);
      if (((int)(fVar25 * (float)iVar6) < in_stack_fffffffffffffee0) ||
         (iVar6 = vec<Minisat::Lit>::size(&in_RDI->trail),
         (int)(in_RDI->percent_ratio * (float)in_RDI->max_trail) < iVar6)) {
        bVar2 = false;
        in_RDI->mediation_used = false;
        in_RDI->freeze_ls_restart_num = in_RDI->restarts_gap;
        local_6c = call_ls(in_stack_00000e48,(bool)in_stack_00000e47);
        if ((bool)local_6c) {
          in_RDI->solved_by_ls = true;
          lbool::lbool(&local_1,'\0');
          return (lbool)local_1.value;
        }
      }
    }
    local_6d = 0;
    bVar5 = usesVSIDS(in_RDI);
    if (bVar5) {
      if (!bVar3) {
        bVar5 = MyQueue<int>::full(&in_RDI->lbd_queue);
        bVar3 = false;
        if (bVar5) {
          iVar6 = MyQueue<int>::avg(&in_RDI->lbd_queue);
          in_stack_fffffffffffffec8 = (float)iVar6 * in_RDI->lbd_avg_compare_limit;
          in_stack_fffffffffffffecc = in_RDI->global_lbd_sum;
          in_stack_fffffffffffffed0 = (float)(long)in_RDI->conflicts_VSIDS;
          in_stack_fffffffffffffed4 = (float)in_RDI->conflicts_VSIDS;
          bVar3 = in_stack_fffffffffffffecc / in_stack_fffffffffffffed4 < in_stack_fffffffffffffec8;
        }
        local_6d = bVar3;
        bVar3 = true;
      }
    }
    else {
      local_6d = *in_RSI < 1;
    }
    if (((local_6d & 1) != 0) ||
       (bVar5 = withinBudget((Solver *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0.x)),
       !bVar5)) {
      MyQueue<int>::clear(&in_RDI->lbd_queue);
      dVar20 = progressEstimate((Solver *)
                                CONCAT17(in_stack_fffffffffffffee7,
                                         CONCAT16(in_stack_fffffffffffffee6,
                                                  CONCAT24(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0))));
      in_RDI->progress_estimate = dVar20;
      uVar7 = getRestartLevel(in_RDI);
      local_74 = uVar7;
      if (3 < in_RDI->verbosity) {
        uVar8 = decisionLevel((Solver *)0x139c77);
        printf("c trigger restart with target level %d from %d\n",(ulong)uVar7,(ulong)uVar8);
      }
      iVar6 = vec<Minisat::Lit>::size(&in_RDI->assumptions);
      if ((iVar6 != 0) &&
         (uVar7 = local_74, iVar6 = vec<Minisat::Lit>::size(&in_RDI->assumptions),
         (int)uVar7 <= iVar6)) {
        local_74 = vec<Minisat::Lit>::size(&in_RDI->assumptions);
      }
      cancelUntil((Solver *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50.x),
                  (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
      lbool::lbool(&local_1,'\x02');
      return (lbool)local_1.value;
    }
    iVar6 = decisionLevel((Solver *)0x139d37);
    if ((iVar6 == 0) &&
       (bVar5 = simplify((Solver *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
       !bVar5)) {
      lbool::lbool(&local_1,'\x01');
      return (lbool)local_1.value;
    }
    if ((in_RDI->core_size_lim != -1) &&
       (iVar6 = vec<unsigned_int>::size(&in_RDI->learnts_core), in_RDI->core_size_lim < iVar6)) {
      local_75 = reduceDB_Core((Solver *)
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      in_RDI->core_size_lim =
           (int)((float)in_RDI->core_size_lim * in_RDI->core_size_lim_inc +
                (float)in_RDI->core_size_lim);
      if (!(bool)local_75) {
        in_RDI->core_size_lim =
             (int)((float)in_RDI->core_size_lim * in_RDI->core_size_lim_inc +
                  (float)in_RDI->core_size_lim);
      }
    }
    iVar6 = vec<unsigned_int>::size(&in_RDI->learnts_tier2);
    if (7000 < iVar6) {
      reduceDB_Tier2((Solver *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    if (in_RDI->next_L_reduce <= in_RDI->conflicts) {
      in_RDI->next_L_reduce = in_RDI->conflicts + 15000;
      reduceDB((Solver *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    local_7c.x = -2;
    while( true ) {
      in_stack_fffffffffffffeb8 = decisionLevel((Solver *)0x139ea5);
      iVar6 = vec<Minisat::Lit>::size(&in_RDI->assumptions);
      if (iVar6 <= in_stack_fffffffffffffeb8) break;
      in_stack_fffffffffffffeb0 = (Solver *)&in_RDI->assumptions;
      iVar6 = decisionLevel((Solver *)0x139ee6);
      pLVar12 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)in_stack_fffffffffffffeb0,iVar6);
      local_88 = pLVar12->x;
      local_80.x = local_88;
      local_81 = value((Solver *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                       in_stack_fffffffffffffec0);
      lbool::lbool(&local_89,'\0');
      bVar5 = lbool::operator==(&local_81,local_89);
      if (!bVar5) {
        local_90 = local_80.x;
        local_8a = value((Solver *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         in_stack_fffffffffffffec0);
        lbool::lbool(&local_91,'\x01');
        bVar5 = lbool::operator==(&local_8a,local_91);
        if (bVar5) {
          operator~(local_80);
          analyzeFinal((Solver *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff24,
                       (vec<Minisat::Lit> *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
          lbool::lbool(&local_1,'\x01');
          return (lbool)local_1.value;
        }
        local_7c.x = local_80.x;
        break;
      }
      newDecisionLevel(in_stack_fffffffffffffeb0);
    }
    in_stack_ffffffffffffff60 = 0xfffffffe;
    bVar5 = Lit::operator==(&local_7c,(Lit)0xfffffffe);
    if (bVar5) {
      in_RDI->decisions = in_RDI->decisions + 1;
      in_stack_ffffffffffffff5c = pickBranchLit(in_stack_fffffffffffffee8);
      local_7c = in_stack_ffffffffffffff5c;
      bVar5 = Lit::operator==(&local_7c,(Lit)0xfffffffe);
      if (bVar5) {
        lbool::lbool(&local_1,'\0');
        return (lbool)local_1.value;
      }
      in_stack_ffffffffffffff54.x = local_7c.x;
      iVar6 = var(local_7c);
      in_RDI->lastDecision = iVar6;
    }
    newDecisionLevel(in_stack_fffffffffffffeb0);
    in_stack_ffffffffffffff50.x = local_7c.x;
    decisionLevel((Solver *)0x13a106);
    uncheckedEnqueue((Solver *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff34,in_stack_ffffffffffffff24.x,in_stack_ffffffffffffff20
                    );
  } while( true );
}

Assistant:

lbool Solver::search(int &nof_conflicts)
{
    TRACE(std::cout << "c start search at level " << decisionLevel() << std::endl);
    assert(ok);
    int backtrack_level;
    int lbd;
    learnt_clause.clear();
    bool cached = false;
    starts++;

    // make sure that all unassigned variables are in the heap
    assert(trail.size() + order_heap->size() >= full_heap_size);

    freeze_ls_restart_num--;
    bool can_call_ls = true;

    // get clauses from parallel solving, if we want to receive
    if (consumeSharedCls != NULL && receiveClauses) consumeSharedCls(issuer);

    if (allow_rephasing && solve_starts + starts > state_change_time) {

        if (!called_initial_sls) call_ls(false);

        /* grow limit after each rephasing */
        state_change_time = state_change_time + state_change_time_inc;
        state_change_time_inc = state_change_time_inc *= state_change_time_inc_inc;

        /* actually rephase */
        if (rand() % 100 < 50)
            info_based_rephase();
        else
            rand_based_rephase();
    }


    // simplify
    //
    if (lcm && conflicts >= curSimplify * nbconfbeforesimplify) {
        TRACE(printf("c ### simplifyAll on conflict : %ld\n", conflicts);)
        if (verbosity >= 1)
            printf("c schedule LCM with: nbClauses: %d, nbLearnts_core: %d, nbLearnts_tier2: %d, nbLearnts_local: %d, "
                   "nbLearnts: %d\n",
                   clauses.size(), learnts_core.size(), learnts_tier2.size(), learnts_local.size(),
                   learnts_core.size() + learnts_tier2.size() + learnts_local.size());
        nbSimplifyAll++;
        if (!simplifyAll()) {
            return l_False;
        }
        curSimplify = (conflicts / nbconfbeforesimplify) + 1;
        nbconfbeforesimplify += incSimplify;
    }

    if (!okay()) return l_False;

    // check whether we want to do inprocessing
    inprocessing();

    prefetchAssumptions();
    CRef this_confl = CRef_Undef, prev_confl = CRef_Undef;

    for (;;) {

        TRACE(check_invariants();)

        TRACE(printf("c propagate literals on level %d with trail size %d\n", decisionLevel(), trail.size());)
        CRef confl = propagate();

        if (confl != CRef_Undef) {
            prev_confl = this_confl;
            this_confl = confl;
            // CONFLICT
            if (usesVSIDS()) {
                if (--var_decay_timer == 0 && var_decay < 0.95)
                    var_decay_timer = var_decay_timer_init, var_decay += 0.01;
            } else if (step_size > min_step_size)
                step_size -= step_size_dec;

            conflicts++;
            nof_conflicts--;
            TRACE(printf("c hit conflict %ld\n", conflicts);)
            if (conflicts == 100000 && learnts_core.size() < 100) core_lbd_cut = 5;
            ConflictData data = FindConflictLevel(confl);
            if (data.nHighestLevel == 0) return l_False;
            // assert(prev_confl != this_confl && "we should not have duplicate conflicts in a row");
            if (data.bOnlyOneLitFromHighest) { //  && prev_confl != this_confl) {
                int btLevel = (prev_confl != this_confl) ? data.nHighestLevel - 1 : data.secondHighestLevel - 1;
                btLevel = btLevel >= 0 ? btLevel : 0;
                TRACE(std::cout << "c chronological backtracking, backtrack until level " << data.nHighestLevel - 1 << std::endl;
                      for (int i = 0; i < ca[confl].size(); ++i) {
                          Lit tl = ca[confl][i];
                          std::cout << "c     " << tl << "@" << level(var(tl)) << " with reason " << reason(var(tl)) << std::endl;
                      })
                cancelUntil(btLevel, false);
                continue;
            }

            learnt_clause.clear();
            if (conflicts > 50000) {
                if (considersDISTANCE()) {
                    if (verbosity) printf("c set DISTANCE to 0\n");
                    disableDISTANCEheuristic();
                }
            } else {
                if (!considersDISTANCE()) {
                    if (verbosity) printf("c set DISTANCE to 1\n");
                    enableDISTANCEheuristic();
                }
            }
            if (current_heuristic == VSIDS_DISTANCE) collectFirstUIP(confl);

            TRACE(std::cout << "c run conflict analysis on conflict clause [" << confl << "]: " << ca[confl] << std::endl);
            analyze(confl, learnt_clause, backtrack_level, lbd);
            TRACE(std::cout << "c retrieved learnt clause " << learnt_clause << std::endl);

            // check chrono backtrack condition
            if ((confl_to_chrono < 0 || confl_to_chrono <= (int64_t)conflicts) && chrono > -1 &&
                (decisionLevel() - backtrack_level) >= chrono) {
                ++chrono_backtrack;
                TRACE(std::cout << "c chronological backtracking until level " << data.nHighestLevel - 1 << std::endl);
                assert((level(var(learnt_clause[0])) == 0 || level(var(learnt_clause[0])) > data.nHighestLevel - 1) &&
                       "learnt clause is asserting");
                cancelUntil(data.nHighestLevel - 1, false);
            } else // default behavior
            {
                ++non_chrono_backtrack;
                TRACE(std::cout << "c non-chrono backtracking until level " << backtrack_level << std::endl);
                cancelUntil(backtrack_level, true);
            }

            lbd--;
            if (usesVSIDS()) {
                cached = false;
                conflicts_VSIDS++;
                lbd_queue.push(lbd);
                global_lbd_sum += (lbd > 50 ? 50 : lbd);
            }

            // share clause with interfaces (ipasir, hordesat)
            shareViaCallback(learnt_clause, lbd);

            if (learnt_clause.size() == 1) {
                uncheckedEnqueue(learnt_clause[0], 0);
            } else {
                CRef cr = ca.alloc(learnt_clause, true);
                TRACE(std::cout << "c allocate learnt clause " << learnt_clause << " with cref= " << cr << std::endl);
                ca[cr].set_lbd(lbd);
                if (lbd <= core_lbd_cut) {
                    learnts_core.push(cr);
                    ca[cr].mark(CORE);
                    ca[cr].touched() = conflicts;
                } else if (lbd <= 6) {
                    learnts_tier2.push(cr);
                    ca[cr].mark(TIER2);
                    ca[cr].touched() = conflicts;
                } else {
                    learnts_local.push(cr);
                    claBumpActivity(ca[cr]);
                }
                attachClause(cr);
                statistics.solveSteps++;

                uncheckedEnqueue(learnt_clause[0], backtrack_level, cr);
#ifdef PRINT_OUT
                std::cout << "new " << ca[cr] << "\n";
                std::cout << "ci " << learnt_clause[0] << " l " << backtrack_level << "\n";
#endif
            }
            if (drup_file) {
#ifdef BIN_DRUP
                binDRUP('a', learnt_clause, drup_file);
#else
                for (int i = 0; i < learnt_clause.size(); i++)
                    fprintf(drup_file, "%i ", (var(learnt_clause[i]) + 1) * (-2 * sign(learnt_clause[i]) + 1));
                fprintf(drup_file, "0\n");
#endif
            }

            if (usesVSIDS()) varDecayActivity();
            claDecayActivity();

            /*if (--learntsize_adjust_cnt == 0){
                learntsize_adjust_confl *= learntsize_adjust_inc;
                learntsize_adjust_cnt    = (int)learntsize_adjust_confl;
                max_learnts             *= learntsize_inc;

            }*/

            if (verbosity >= 1 && (conflicts % status_every) == 0)
                printf("c | %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n", (int)conflicts,
                       (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals,
                       (int)max_learnts, nLearnts(), (double)learnts_literals / nLearnts(), progressEstimate() * 100);

            // the top_trail_soln should be update after each conflict
            if (trail.size() > max_trail) {
                max_trail = trail.size();

                int var_nums = nVars();
                for (int idx_i = 0; idx_i < var_nums; ++idx_i) {
                    lbool value_i = value(idx_i);
                    if (value_i == l_Undef)
                        top_trail_soln[idx_i] = !polarity[idx_i];
                    else {
                        top_trail_soln[idx_i] = value_i == l_True ? 1 : 0;
                    }
                }
            }

        } else {
            // NO CONFLICT
            if (solve_starts + starts > state_change_time) {

                if (can_call_ls && freeze_ls_restart_num < 1 && mediation_used &&
                    (trail.size() > (int)(conflict_ratio * nVars()) || trail.size() > (int)(percent_ratio * max_trail)) //&& up_time_ratio * search_start_cpu_time > ls_used_time
                ) {

                    can_call_ls = false;
                    mediation_used = false;
                    freeze_ls_restart_num = restarts_gap;
                    bool res = call_ls(true);

                    if (res) {
                        solved_by_ls = true;
                        return l_True;
                    }
                }
            }

            bool restart = false;
            if (!usesVSIDS())
                restart = nof_conflicts <= 0;
            else if (!cached) {
                restart = lbd_queue.full() && (lbd_queue.avg() * lbd_avg_compare_limit > global_lbd_sum / conflicts_VSIDS);
                cached = true;
            }
            if (restart || !withinBudget()) {
                TRACE(std::cout << "c interrupt search due to restart or budget" << std::endl);
                lbd_queue.clear();
                cached = false;
                // Reached bound on number of conflicts:
                progress_estimate = progressEstimate();

                int restartLevel = getRestartLevel();
                if (verbosity > 3)
                    printf("c trigger restart with target level %d from %d\n", restartLevel, decisionLevel());
                restartLevel = (assumptions.size() && restartLevel <= assumptions.size()) ? assumptions.size() : restartLevel;
                TRACE(std::cout << "c jump to level " << restartLevel << " for restart" << std::endl);
                cancelUntil(restartLevel);
                return l_Undef;
            }

            // Simplify the set of problem clauses:
            if (decisionLevel() == 0 && !simplify()) return l_False;

            if (core_size_lim != -1 && learnts_core.size() > core_size_lim) {
                TRACE(std::cout << "c reduce core learnt clauses" << std::endl);
                bool successful_reduced = reduceDB_Core();
                core_size_lim += core_size_lim * core_size_lim_inc;
                /* add extra penalty, if no success */
                if (!successful_reduced) core_size_lim += core_size_lim * core_size_lim_inc;
            }

            if (learnts_tier2.size() > 7000) {
                TRACE(std::cout << "c reduce tier 2 clauses" << std::endl);
                reduceDB_Tier2();
            }

            if (conflicts >= next_L_reduce) {
                next_L_reduce = conflicts + 15000;
                TRACE(std::cout << "c reduce learnt clauses" << std::endl);
                reduceDB();
            }

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()) {
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True) {
                    // Dummy decision level:
                    newDecisionLevel();
                } else if (value(p) == l_False) {
                    analyzeFinal(~p, conflict);
                    return l_False;
                } else {
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef) {
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef)
                    // Model found:
                    return l_True;

                lastDecision = var(next);
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            TRACE(std::cout << "c use literal " << next << " as decision literal on level " << decisionLevel() << std::endl);
            uncheckedEnqueue(next, decisionLevel());
#ifdef PRINT_OUT
            std::cout << "d " << next << " l " << decisionLevel() << "\n";
#endif
        }
    }

    // store minimum of assumptions and current level, to forward assumptions again
    last_used_assumptions = assumptions.size() > decisionLevel() ? decisionLevel() : assumptions.size();
}